

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

Region * __thiscall
TuxProc::Process::getRegion(Process *this,char *regionName,int index,uint8_t filter)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  reference this_00;
  char *__s2;
  byte in_CL;
  int in_EDX;
  vector<TuxProc::Region,_std::allocator<TuxProc::Region>_> *in_RSI;
  long in_RDI;
  Region *region;
  iterator __end1;
  iterator __begin1;
  vector<TuxProc::Region,_std::allocator<TuxProc::Region>_> *__range1;
  int counter;
  vector<TuxProc::Region,_std::allocator<TuxProc::Region>_> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  __normal_iterator<TuxProc::Region_*,_std::vector<TuxProc::Region,_std::allocator<TuxProc::Region>_>_>
  local_38;
  long local_30;
  int local_24;
  byte local_1d;
  int local_1c;
  vector<TuxProc::Region,_std::allocator<TuxProc::Region>_> *local_18;
  
  local_24 = 0;
  local_30 = in_RDI + 0x28;
  local_1d = in_CL;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_38._M_current =
       (Region *)
       std::vector<TuxProc::Region,_std::allocator<TuxProc::Region>_>::begin
                 (in_stack_ffffffffffffffa8);
  std::vector<TuxProc::Region,_std::allocator<TuxProc::Region>_>::end(in_stack_ffffffffffffffa8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<TuxProc::Region_*,_std::vector<TuxProc::Region,_std::allocator<TuxProc::Region>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (__normal_iterator<TuxProc::Region_*,_std::vector<TuxProc::Region,_std::allocator<TuxProc::Region>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) {
      return (Region *)0x0;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<TuxProc::Region_*,_std::vector<TuxProc::Region,_std::allocator<TuxProc::Region>_>_>
              ::operator*(&local_38);
    in_stack_ffffffffffffffb4 = (uint)local_1d;
    bVar2 = Region::getMode(this_00);
    if ((in_stack_ffffffffffffffb4 & bVar2) == (uint)local_1d) {
      in_stack_ffffffffffffffa8 = local_18;
      __s2 = Region::getFileName(this_00);
      iVar3 = strcmp((char *)in_stack_ffffffffffffffa8,__s2);
      if (iVar3 == 0) {
        if (local_24 == local_1c) {
          return this_00;
        }
        local_24 = local_24 + 1;
      }
    }
    __gnu_cxx::
    __normal_iterator<TuxProc::Region_*,_std::vector<TuxProc::Region,_std::allocator<TuxProc::Region>_>_>
    ::operator++(&local_38);
  } while( true );
}

Assistant:

Region* Process::getRegion(const char* regionName, int index, uint8_t filter)
{
    int counter = 0;
    for (Region& region : regions) {
        if (((filter & region.getMode()) == filter) && (strcmp(regionName, region.getFileName()) == 0)) {
            if (counter == index) return &region;
            else counter++;
        }
    }
    return nullptr;
}